

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_ssse3_intr.c
# Opt level: O0

void ihevc_deblk_luma_horz_ssse3
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined3 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  undefined4 uVar43;
  int iVar44;
  int in_ECX;
  int iVar45;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  byte bVar46;
  byte bVar47;
  short sVar48;
  byte bVar60;
  byte bVar61;
  ushort uVar49;
  int iVar50;
  byte bVar62;
  byte bVar63;
  short sVar64;
  byte bVar66;
  byte bVar67;
  ushort uVar65;
  byte bVar68;
  byte bVar69;
  short sVar70;
  byte bVar72;
  byte bVar73;
  ushort uVar71;
  byte bVar74;
  byte bVar75;
  short sVar76;
  byte bVar78;
  byte bVar79;
  ushort uVar77;
  byte bVar80;
  byte bVar81;
  short sVar82;
  byte bVar84;
  byte bVar85;
  ushort uVar83;
  byte bVar86;
  byte bVar87;
  short sVar88;
  byte bVar90;
  byte bVar91;
  ushort uVar89;
  byte bVar92;
  byte bVar93;
  short sVar94;
  byte bVar96;
  byte bVar97;
  ushort uVar95;
  byte bVar98;
  byte bVar99;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar100;
  byte bVar102;
  byte bVar103;
  ushort uVar101;
  int in_stack_00000008;
  LWORD64 maskq1;
  LWORD64 maskq0;
  LWORD64 maskp1;
  LWORD64 maskp0;
  __m128i consttc_8x16b;
  __m128i const2_8x16b_1;
  __m128i coefdelta_0_8x16b;
  __m128i tmp2_const_8x16b;
  __m128i tmp1_const_8x16b;
  __m128i tmp0_const_8x16b;
  __m128i tmp_delta1_8x16b;
  __m128i tmp_delta0_8x16b;
  LWORD64 tc2;
  LWORD64 mask;
  __m128i const2tc_8x16b;
  __m128i const2_8x16b;
  __m128i temp_str1_16x8b;
  __m128i temp_str0_16x8b;
  __m128i temp_pq2_str0_16x8b;
  __m128i temp_pq1_str1_16x8b;
  __m128i temp_pq1_str0_16x8b;
  __m128i temp_pq0_str0_16x8b;
  __m128i temp_coef1_8x16b;
  __m128i temp_coef0_8x16b;
  __m128i mask_16x8b;
  __m128i mask_de_result_8x16b;
  __m128i mask_d_result_4x32b;
  __m128i coef_8x16b;
  __m128i src_tmp_q_1_8x16b;
  __m128i src_tmp_q_0_8x16b;
  __m128i src_tmp_p_1_8x16b;
  __m128i src_tmp_p_0_8x16b;
  __m128i tmp_pq_str0_8x16b;
  __m128i src_p2_8x16b;
  __m128i tmp_pq_str1_8x16b;
  __m128i src_q2_8x16b;
  __m128i src_p1_8x16b;
  __m128i src_p0_8x16b;
  __m128i src_q1_8x16b;
  __m128i src_q0_8x16b;
  WORD32 deq;
  WORD32 dep;
  WORD32 de;
  WORD32 d_sam3;
  WORD32 d_sam0;
  WORD32 de_3;
  WORD32 de_2;
  WORD32 de_1;
  WORD32 de_0;
  WORD32 d;
  WORD32 dq;
  WORD32 dp;
  WORD32 d3;
  WORD32 d0;
  WORD32 tc;
  WORD32 beta;
  WORD32 tc_indx;
  WORD32 beta_indx;
  WORD32 qp_luma;
  int local_17b8;
  int local_17b4;
  int local_17b0;
  int local_17ac;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  ulong local_16f8;
  ulong uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined1 local_1668 [8];
  undefined8 uStack_1660;
  int local_1638;
  int iStack_1630;
  int iStack_162c;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  ushort local_1578;
  ushort uStack_1570;
  undefined8 local_1568;
  ushort uStack_1560;
  uint local_1550;
  uint local_154c;
  int local_1548;
  uint local_1544;
  uint local_1540;
  ushort local_1018;
  ushort uStack_1016;
  ushort uStack_1014;
  ushort uStack_1012;
  ushort uStack_1010;
  ushort uStack_100e;
  ushort uStack_100c;
  ushort uStack_100a;
  short sStack_ef0;
  short sStack_eee;
  short sStack_eec;
  short sStack_eea;
  short local_ee8;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ee0;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  short local_ed8;
  short sStack_ed6;
  short sStack_ed4;
  short sStack_ed2;
  short sStack_ed0;
  short sStack_ece;
  short sStack_ecc;
  short sStack_eca;
  undefined1 local_c88;
  undefined1 uStack_c87;
  undefined1 uStack_c86;
  undefined1 uStack_c85;
  byte local_c78;
  byte bStack_c77;
  byte bStack_c76;
  byte bStack_c75;
  byte bStack_c74;
  byte bStack_c73;
  byte bStack_c72;
  byte bStack_c71;
  byte local_c68;
  byte bStack_c67;
  byte bStack_c66;
  byte bStack_c65;
  byte bStack_c64;
  byte bStack_c63;
  byte bStack_c62;
  byte bStack_c61;
  byte local_c58;
  byte bStack_c57;
  byte bStack_c56;
  byte bStack_c55;
  byte bStack_c54;
  byte bStack_c53;
  byte bStack_c52;
  byte bStack_c51;
  byte local_c48;
  byte bStack_c47;
  byte bStack_c46;
  byte bStack_c45;
  undefined1 local_c38;
  undefined1 uStack_c37;
  undefined1 uStack_c36;
  undefined1 uStack_c35;
  byte local_c28;
  byte bStack_c27;
  byte bStack_c26;
  byte bStack_c25;
  byte bStack_c24;
  byte bStack_c23;
  byte bStack_c22;
  byte bStack_c21;
  byte local_c18;
  byte bStack_c17;
  byte bStack_c16;
  byte bStack_c15;
  byte bStack_c14;
  byte bStack_c13;
  byte bStack_c12;
  byte bStack_c11;
  int local_be8;
  int iStack_be4;
  int iStack_be0;
  int iStack_bdc;
  int local_b78;
  int local_b58;
  int local_b38;
  undefined2 uStack_a96;
  undefined2 uStack_a94;
  undefined2 uStack_a92;
  undefined2 uStack_a86;
  undefined2 uStack_a84;
  undefined2 uStack_a82;
  undefined4 uStack_9e4;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 local_9a8;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 local_988;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  ushort uStack_6e6;
  ushort uStack_6e4;
  ushort uStack_6e2;
  ushort uStack_6de;
  ushort uStack_6dc;
  ushort uStack_6da;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  ushort uStack_6c6;
  ushort uStack_6c4;
  ushort uStack_6c2;
  ushort uStack_6c0;
  ushort uStack_6be;
  ushort uStack_6bc;
  ushort uStack_6ba;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  ushort uStack_686;
  ushort uStack_684;
  ushort uStack_682;
  ushort uStack_680;
  ushort uStack_67e;
  ushort uStack_67c;
  ushort uStack_67a;
  ushort uStack_646;
  ushort uStack_644;
  ushort uStack_642;
  ushort uStack_63e;
  ushort uStack_63c;
  ushort uStack_63a;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_5e8;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5e0;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  short local_588;
  short sStack_586;
  short sStack_584;
  short sStack_582;
  short sStack_580;
  short sStack_57e;
  short sStack_57c;
  short sStack_57a;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  undefined4 uStack_440;
  undefined4 uStack_420;
  undefined4 uStack_410;
  undefined4 uStack_400;
  undefined4 uStack_3e0;
  byte local_3d8;
  byte bStack_3d7;
  byte bStack_3d6;
  byte bStack_3d5;
  byte bStack_3d4;
  byte bStack_3d3;
  byte bStack_3d2;
  byte bStack_3d1;
  byte bStack_3d0;
  byte bStack_3cf;
  byte bStack_3ce;
  byte bStack_3cd;
  byte bStack_3cc;
  byte bStack_3cb;
  byte bStack_3ca;
  byte bStack_3c9;
  byte bStack_3c0;
  byte bStack_3bf;
  byte bStack_3be;
  byte bStack_3bd;
  byte local_3b8;
  byte bStack_3b7;
  byte bStack_3b6;
  byte bStack_3b5;
  byte bStack_3b4;
  byte bStack_3b3;
  byte bStack_3b2;
  byte bStack_3b1;
  byte bStack_3b0;
  byte bStack_3af;
  byte bStack_3ae;
  byte bStack_3ad;
  byte bStack_3ac;
  byte bStack_3ab;
  byte bStack_3aa;
  byte bStack_3a9;
  byte local_398;
  byte bStack_397;
  byte bStack_396;
  byte bStack_395;
  byte bStack_390;
  byte bStack_38f;
  byte bStack_38e;
  byte bStack_38d;
  byte bStack_38c;
  byte bStack_38b;
  byte bStack_38a;
  byte bStack_389;
  byte local_378;
  byte bStack_377;
  byte bStack_376;
  byte bStack_375;
  byte bStack_374;
  byte bStack_373;
  byte bStack_372;
  byte bStack_371;
  byte bStack_370;
  byte bStack_36f;
  byte bStack_36e;
  byte bStack_36d;
  byte bStack_36c;
  byte bStack_36b;
  byte bStack_36a;
  byte bStack_369;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  
  if (in_EDX < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                  ,0x235,
                  "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (((int)maskq1 == 0) && ((uint)maskq0 == 0)) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                  ,0x236,
                  "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar44 = in_ECX + in_R8D + 1 >> 1;
  if (iVar44 + in_R9D * 2 < 0x34) {
    if (iVar44 + in_R9D * 2 < 0) {
      local_17b0 = 0;
    }
    else {
      local_17b0 = iVar44 + in_R9D * 2;
    }
    local_17ac = local_17b0;
  }
  else {
    local_17ac = 0x33;
  }
  iVar45 = in_EDX >> 1;
  if (iVar44 + iVar45 * 2 + in_stack_00000008 * 2 < 0x36) {
    if (iVar44 + iVar45 * 2 + in_stack_00000008 * 2 < 0) {
      local_17b8 = 0;
    }
    else {
      local_17b8 = iVar44 + iVar45 * 2 + in_stack_00000008 * 2;
    }
    local_17b4 = local_17b8;
  }
  else {
    local_17b4 = 0x35;
  }
  iVar44 = gai4_ihevc_beta_table[local_17ac];
  iVar45 = gai4_ihevc_tc_table[local_17b4];
  if (iVar45 != 0) {
    uVar1 = *in_RDI;
    uVar2 = *(undefined8 *)((long)in_RDI + (long)in_ESI);
    uVar3 = *(undefined8 *)((long)in_RDI - (long)in_ESI);
    uVar4 = *(undefined8 *)((long)in_RDI - (long)(in_ESI * 2));
    uVar5 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 2));
    uVar6 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 3));
    uVar7 = *(undefined8 *)((long)in_RDI - (long)(in_ESI * 3));
    uVar8 = *(undefined8 *)((long)in_RDI - (long)(in_ESI << 2));
    local_c18 = (byte)uVar4;
    bStack_c17 = (byte)((ulong)uVar4 >> 8);
    bStack_c16 = (byte)((ulong)uVar4 >> 0x10);
    bStack_c15 = (byte)((ulong)uVar4 >> 0x18);
    bStack_c14 = (byte)((ulong)uVar4 >> 0x20);
    bStack_c13 = (byte)((ulong)uVar4 >> 0x28);
    bStack_c12 = (byte)((ulong)uVar4 >> 0x30);
    bStack_c11 = (byte)((ulong)uVar4 >> 0x38);
    local_c28 = (byte)uVar3;
    bStack_c27 = (byte)((ulong)uVar3 >> 8);
    bStack_c26 = (byte)((ulong)uVar3 >> 0x10);
    bStack_c25 = (byte)((ulong)uVar3 >> 0x18);
    bStack_c24 = (byte)((ulong)uVar3 >> 0x20);
    bStack_c23 = (byte)((ulong)uVar3 >> 0x28);
    bStack_c22 = (byte)((ulong)uVar3 >> 0x30);
    bStack_c21 = (byte)((ulong)uVar3 >> 0x38);
    local_c38 = (undefined1)uVar8;
    uStack_c37 = (undefined1)((ulong)uVar8 >> 8);
    uStack_c36 = (undefined1)((ulong)uVar8 >> 0x10);
    uStack_c35 = (undefined1)((ulong)uVar8 >> 0x18);
    local_c48 = (byte)uVar7;
    bStack_c47 = (byte)((ulong)uVar7 >> 8);
    bStack_c46 = (byte)((ulong)uVar7 >> 0x10);
    bStack_c45 = (byte)((ulong)uVar7 >> 0x18);
    local_c58 = (byte)uVar1;
    bStack_c57 = (byte)((ulong)uVar1 >> 8);
    bStack_c56 = (byte)((ulong)uVar1 >> 0x10);
    bStack_c55 = (byte)((ulong)uVar1 >> 0x18);
    bStack_c54 = (byte)((ulong)uVar1 >> 0x20);
    bStack_c53 = (byte)((ulong)uVar1 >> 0x28);
    bStack_c52 = (byte)((ulong)uVar1 >> 0x30);
    bStack_c51 = (byte)((ulong)uVar1 >> 0x38);
    local_c68 = (byte)uVar2;
    bStack_c67 = (byte)((ulong)uVar2 >> 8);
    bStack_c66 = (byte)((ulong)uVar2 >> 0x10);
    bStack_c65 = (byte)((ulong)uVar2 >> 0x18);
    bStack_c64 = (byte)((ulong)uVar2 >> 0x20);
    bStack_c63 = (byte)((ulong)uVar2 >> 0x28);
    bStack_c62 = (byte)((ulong)uVar2 >> 0x30);
    bStack_c61 = (byte)((ulong)uVar2 >> 0x38);
    local_c78 = (byte)uVar5;
    bStack_c77 = (byte)((ulong)uVar5 >> 8);
    bStack_c76 = (byte)((ulong)uVar5 >> 0x10);
    bStack_c75 = (byte)((ulong)uVar5 >> 0x18);
    bStack_c74 = (byte)((ulong)uVar5 >> 0x20);
    bStack_c73 = (byte)((ulong)uVar5 >> 0x28);
    bStack_c72 = (byte)((ulong)uVar5 >> 0x30);
    bStack_c71 = (byte)((ulong)uVar5 >> 0x38);
    local_c88 = (undefined1)uVar6;
    uStack_c87 = (undefined1)((ulong)uVar6 >> 8);
    uStack_c86 = (undefined1)((ulong)uVar6 >> 0x10);
    uStack_c85 = (undefined1)((ulong)uVar6 >> 0x18);
    uVar9 = CONCAT12(local_c18,CONCAT11(local_c48,local_c38));
    auVar52[3] = local_c28;
    auVar52._0_3_ = uVar9;
    auVar52[4] = local_c58;
    auVar52[5] = local_c68;
    auVar52[6] = local_c78;
    auVar52[7] = local_c88;
    auVar52[10] = bStack_c15;
    auVar52._8_2_ = CONCAT11(bStack_c45,uStack_c35);
    auVar52[0xb] = bStack_c25;
    auVar52[0xc] = bStack_c55;
    auVar52[0xd] = bStack_c65;
    auVar52[0xe] = bStack_c75;
    auVar52[0xf] = uStack_c85;
    auVar51._8_4_ = 0x3000704;
    auVar51._12_4_ = 0xb080f0c;
    auVar51._0_4_ = -0x7f7ffbfd;
    auVar51._4_4_ = -0x7f7ff3f5;
    auVar51 = pshufb(auVar52,auVar51);
    auVar55[3] = local_c28;
    auVar55._0_3_ = uVar9;
    auVar55[4] = local_c58;
    auVar55[5] = local_c68;
    auVar55[6] = local_c78;
    auVar55[7] = local_c88;
    auVar55[10] = bStack_c15;
    auVar55._8_2_ = CONCAT11(bStack_c45,uStack_c35);
    auVar55[0xb] = bStack_c25;
    auVar55[0xc] = bStack_c55;
    auVar55[0xd] = bStack_c65;
    auVar55[0xe] = bStack_c75;
    auVar55[0xf] = uStack_c85;
    auVar54[8] = '\0';
    auVar54[9] = '\x01';
    auVar54[10] = -2;
    auVar54[0xb] = '\x01';
    auVar54[0xc] = '\x01';
    auVar54[0xd] = -2;
    auVar54[0xe] = '\x01';
    auVar54[0xf] = '\0';
    auVar54[0] = '\0';
    auVar54[1] = '\x01';
    auVar54[2] = -2;
    auVar54[3] = '\x01';
    auVar54[4] = '\x01';
    auVar54[5] = -2;
    auVar54[6] = '\x01';
    auVar54[7] = '\0';
    auVar52 = pmaddubsw(auVar55,auVar54);
    auVar57._8_8_ = 0x1000100010001;
    auVar57._0_8_ = 0x1000100010001;
    auVar52 = pmaddwd(auVar52,auVar57);
    uStack_1660._0_1_ = 0xff;
    local_1668 = (undefined1  [8])0x1ff01ff01ff01ff;
    uStack_1660._1_1_ = 1;
    uStack_1660._2_1_ = 0xff;
    uStack_1660._3_1_ = 1;
    uStack_1660._4_1_ = 0xff;
    uStack_1660._5_1_ = 1;
    uStack_1660._6_1_ = 0xff;
    uStack_1660._7_1_ = 1;
    auVar53._8_8_ = uStack_1660;
    auVar53._0_8_ = 0x1ff01ff01ff01ff;
    auVar51 = pmaddubsw(auVar51,auVar53);
    uStack_1660._0_1_ = 1;
    local_1668 = (undefined1  [8])0x1000100010001;
    uStack_1660._1_1_ = 0;
    uStack_1660._2_2_ = 1;
    uStack_1660._4_2_ = 1;
    uStack_1660._6_2_ = 1;
    auVar52 = pabsd(auVar52,auVar52);
    local_1638 = auVar52._0_4_;
    iStack_1630 = auVar52._8_4_;
    iStack_162c = auVar52._12_4_;
    iVar50 = auVar52._4_4_ + local_1638;
    auVar51 = pabsw(auVar51,auVar51);
    auVar56._8_8_ = uStack_1660;
    auVar56._0_8_ = 0x1000100010001;
    auVar51 = pmaddwd(auVar51,auVar56);
    local_b38 = auVar51._0_4_;
    local_b58 = auVar51._4_4_;
    local_b78 = auVar51._8_4_;
    local_1548 = 0;
    local_154c = 0;
    local_1550 = 0;
    if (iVar50 + iStack_1630 + iStack_162c < iVar44) {
      local_1540 = 0;
      if (((iVar50 * 2 < iVar44 >> 2) && (local_b78 < iVar44 >> 3)) &&
         (local_b38 < iVar45 * 5 + 1 >> 1)) {
        local_1540 = 1;
      }
      local_1544 = 0;
      if ((((iStack_1630 + iStack_162c) * 2 < iVar44 >> 2) && (auVar51._12_4_ < iVar44 >> 3)) &&
         (local_b58 < iVar45 * 5 + 1 >> 1)) {
        local_1544 = 1;
      }
      local_1548 = (local_1540 & local_1544) + 1;
      local_154c = (uint)(local_1638 + iStack_1630 < iVar44 + (iVar44 >> 1) >> 3);
      local_1550 = (uint)(auVar52._4_4_ + iStack_162c < iVar44 + (iVar44 >> 1) >> 3);
      if (iVar45 < 2) {
        local_154c = 0;
        local_1550 = 0;
      }
    }
    if (local_1548 != 0) {
      uStack_9c4 = (undefined4)((ulong)uVar7 >> 0x20);
      uStack_994 = (undefined4)((ulong)uVar1 >> 0x20);
      uStack_9b4 = (undefined4)((ulong)uVar2 >> 0x20);
      uStack_9d4 = (undefined4)((ulong)uVar5 >> 0x20);
      if (local_1548 == 2) {
        local_16c8._4_4_ =
             (uint)(((ulong)(uint)maskq0 << 0x3f) >> 0x20) |
             (uint)((ulong)((long)(int)maskq1 << 0x1f) >> 0x20);
        uVar42 = local_16c8._4_4_;
        local_1688._0_2_ = CONCAT11(local_c28,local_c18);
        local_1688._0_3_ = CONCAT12(bStack_c17,(undefined2)local_1688);
        local_1688._0_4_ = CONCAT13(bStack_c27,(undefined3)local_1688);
        local_1688._0_5_ = CONCAT14(bStack_c16,(undefined4)local_1688);
        local_1688._0_6_ = CONCAT15(bStack_c26,(undefined5)local_1688);
        local_1688._0_7_ = CONCAT16(bStack_c15,(undefined6)local_1688);
        local_1688 = CONCAT17(bStack_c25,(undefined7)local_1688);
        local_16c8._0_4_ = CONCAT13(bStack_c67,CONCAT12(bStack_c57,CONCAT11(local_c68,local_c58)));
        local_16c8 = CONCAT17(bStack_c65,
                              CONCAT16(bStack_c55,
                                       CONCAT15(bStack_c66,CONCAT14(bStack_c56,(int)local_16c8))));
        uStack_16e0._0_1_ = 1;
        local_16e8 = 0x101010101010101;
        uStack_16e0._1_1_ = 1;
        uStack_16e0._2_1_ = 1;
        uStack_16e0._3_1_ = 1;
        uStack_16e0._4_1_ = 1;
        uStack_16e0._5_1_ = 1;
        uStack_16e0._6_1_ = 1;
        uStack_16e0._7_1_ = 1;
        auVar20._8_8_ = local_16c8;
        auVar20._0_8_ = local_1688;
        auVar19._8_8_ = uStack_16e0;
        auVar19._0_8_ = 0x101010101010101;
        auVar51 = pmaddubsw(auVar20,auVar19);
        local_1698._0_4_ = CONCAT13(bStack_c57,CONCAT12(bStack_c27,CONCAT11(local_c58,local_c28)));
        local_1698._0_6_ = CONCAT15(bStack_c56,CONCAT14(bStack_c26,(undefined4)local_1698));
        local_1698 = CONCAT17(bStack_c55,CONCAT16(bStack_c25,(undefined6)local_1698));
        local_16a8 = CONCAT17(bStack_c75,
                              CONCAT16(bStack_c65,
                                       CONCAT15(bStack_c76,
                                                CONCAT14(bStack_c66,
                                                         CONCAT13(bStack_c77,
                                                                  CONCAT12(bStack_c67,
                                                                           CONCAT11(local_c78,
                                                                                    local_c68)))))))
        ;
        local_16d8 = CONCAT17(bStack_c45,
                              CONCAT16(bStack_c15,
                                       CONCAT15(bStack_c46,
                                                CONCAT14(bStack_c16,
                                                         CONCAT13(bStack_c47,
                                                                  CONCAT12(bStack_c17,
                                                                           CONCAT11(local_c48,
                                                                                    local_c18)))))))
        ;
        auVar18._8_8_ = local_1698;
        auVar18._0_8_ = local_1698;
        auVar17._8_8_ = uStack_16e0;
        auVar17._0_8_ = 0x101010101010101;
        auVar52 = pmaddubsw(auVar18,auVar17);
        auVar16._8_8_ = local_16a8;
        auVar16._0_8_ = local_16d8;
        auVar15._8_8_ = uStack_16e0;
        auVar15._0_8_ = 0x101010101010101;
        auVar53 = pmaddubsw(auVar16,auVar15);
        local_16c8._0_4_ = (int)((long)(int)maskq1 << 0x1f);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (long)(iVar45 * 2);
        auVar54 = pshufb(auVar10,ZEXT816(0));
        uStack_16c0._0_4_ = (int)local_16c8 >> ZEXT416(0x1f);
        uStack_16c0._4_4_ = (int)uVar42 >> ZEXT416(0x1f);
        local_16c8 = CONCAT44(uStack_16c0._4_4_,(int)uStack_16c0);
        local_16f8 = auVar54._0_8_;
        uStack_16f0 = auVar54._8_8_;
        local_16f8 = local_16f8 & local_16c8;
        uStack_16f0 = uStack_16f0 & uStack_16c0;
        local_988 = (undefined4)uVar3;
        local_998 = (undefined4)uVar1;
        local_1588 = CONCAT44(local_998,local_988);
        local_9a8 = (undefined4)uVar4;
        local_9b8 = (undefined4)uVar2;
        local_1568 = CONCAT44(local_9b8,local_9a8);
        auVar25._8_8_ = local_1568;
        auVar25._0_8_ = local_1588;
        auVar24._8_8_ = uStack_16f0;
        auVar24._0_8_ = local_16f8;
        auVar54 = paddusb(auVar25,auVar24);
        auVar30._8_8_ = local_1568;
        auVar30._0_8_ = local_1588;
        auVar29._8_8_ = uStack_16f0;
        auVar29._0_8_ = local_16f8;
        auVar55 = psubusb(auVar30,auVar29);
        local_15d8._0_4_ = CONCAT13(uStack_c37,CONCAT12(bStack_c47,CONCAT11(local_c38,local_c48)));
        local_15d8._0_6_ = CONCAT15(uStack_c36,CONCAT14(bStack_c46,(undefined4)local_15d8));
        local_15d8 = CONCAT17(uStack_c35,CONCAT16(bStack_c45,(undefined6)local_15d8));
        local_16b8._0_4_ = CONCAT13(uStack_c87,CONCAT12(bStack_c77,CONCAT11(local_c88,local_c78)));
        local_16b8._0_6_ = CONCAT15(uStack_c86,CONCAT14(bStack_c76,(undefined4)local_16b8));
        local_16b8 = CONCAT17(uStack_c85,CONCAT16(bStack_c75,(undefined6)local_16b8));
        auVar26._8_8_ = uStack_16e0;
        auVar26._0_8_ = 0x101010101010101;
        auVar56 = psllw(auVar26,ZEXT416(1));
        local_9c8 = (undefined4)uVar7;
        local_9d8 = (undefined4)uVar5;
        local_15c8 = CONCAT44(local_9d8,local_9c8);
        uStack_15c0 = CONCAT44(uStack_9d4,uStack_9c4);
        auVar14._8_8_ = local_16b8;
        auVar14._0_8_ = local_15d8;
        auVar57 = pmaddubsw(auVar14,auVar56);
        auVar23._8_8_ = uStack_15c0;
        auVar23._0_8_ = local_15c8;
        auVar22._8_8_ = uStack_16f0;
        auVar22._0_8_ = local_16f8;
        auVar58 = paddusb(auVar23,auVar22);
        auVar28._8_8_ = uStack_15c0;
        auVar28._0_8_ = local_15c8;
        auVar27._8_8_ = uStack_16f0;
        auVar27._0_8_ = local_16f8;
        auVar59 = psubusb(auVar28,auVar27);
        local_508 = auVar51._0_2_;
        sStack_506 = auVar51._2_2_;
        sStack_504 = auVar51._4_2_;
        sStack_502 = auVar51._6_2_;
        sStack_500 = auVar51._8_2_;
        sStack_4fe = auVar51._10_2_;
        sStack_4fc = auVar51._12_2_;
        sStack_4fa = auVar51._14_2_;
        local_528 = auVar52._0_2_;
        sStack_526 = auVar52._2_2_;
        sStack_524 = auVar52._4_2_;
        sStack_522 = auVar52._6_2_;
        sStack_520 = auVar52._8_2_;
        sStack_51e = auVar52._10_2_;
        sStack_51c = auVar52._12_2_;
        sStack_51a = auVar52._14_2_;
        local_538 = auVar53._0_2_;
        sStack_536 = auVar53._2_2_;
        sStack_534 = auVar53._4_2_;
        sStack_532 = auVar53._6_2_;
        sStack_530 = auVar53._8_2_;
        sStack_52e = auVar53._10_2_;
        sStack_52c = auVar53._12_2_;
        sStack_52a = auVar53._14_2_;
        local_1018 = auVar56._0_2_;
        uStack_1016 = auVar56._2_2_;
        uStack_1014 = auVar56._4_2_;
        uStack_1012 = auVar56._6_2_;
        uStack_1010 = auVar56._8_2_;
        uStack_100e = auVar56._10_2_;
        uStack_100c = auVar56._12_2_;
        uStack_100a = auVar56._14_2_;
        local_1018 = local_1018 >> 8;
        uStack_1016 = uStack_1016 >> 8;
        uStack_1014 = uStack_1014 >> 8;
        uStack_1012 = uStack_1012 >> 8;
        uStack_1010 = uStack_1010 >> 8;
        uStack_100e = uStack_100e >> 8;
        uStack_100c = uStack_100c >> 8;
        uStack_100a = uStack_100a >> 8;
        sVar48 = local_528 + local_538 + local_1018;
        sVar64 = sStack_526 + sStack_536 + uStack_1016;
        sVar70 = sStack_524 + sStack_534 + uStack_1014;
        sVar76 = sStack_522 + sStack_532 + uStack_1012;
        sVar82 = sStack_520 + sStack_530 + uStack_1010;
        sVar88 = sStack_51e + sStack_52e + uStack_100e;
        sVar94 = sStack_51c + sStack_52c + uStack_100c;
        sVar100 = sStack_51a + sStack_52a + uStack_100a;
        local_1698._0_4_ = CONCAT22(sVar64,sVar48);
        local_1698._0_6_ = CONCAT24(sVar70,(undefined4)local_1698);
        local_1698 = CONCAT26(sVar76,(undefined6)local_1698);
        uStack_1690._0_2_ = sVar82;
        uStack_1690._2_2_ = sVar88;
        uStack_1690._4_2_ = sVar94;
        uStack_1690._6_2_ = sVar100;
        local_588 = auVar57._0_2_;
        sStack_586 = auVar57._2_2_;
        sStack_584 = auVar57._4_2_;
        sStack_582 = auVar57._6_2_;
        sStack_580 = auVar57._8_2_;
        sStack_57e = auVar57._10_2_;
        sStack_57c = auVar57._12_2_;
        sStack_57a = auVar57._14_2_;
        local_1688._0_4_ =
             CONCAT22(sVar64 + sStack_506 + sStack_4fe + uStack_1016,
                      sVar48 + local_508 + sStack_500 + local_1018);
        local_1688._0_6_ =
             CONCAT24(sVar70 + sStack_504 + sStack_4fc + uStack_1014,(undefined4)local_1688);
        local_1688 = CONCAT26(sVar76 + sStack_502 + sStack_4fa + uStack_1012,(undefined6)local_1688)
        ;
        uStack_1680._0_2_ = sVar82 + sStack_500 + local_508 + uStack_1010;
        uStack_1680._2_2_ = sVar88 + sStack_4fe + sStack_506 + uStack_100e;
        uStack_1680._4_2_ = sVar94 + sStack_4fc + sStack_504 + uStack_100c;
        uStack_1680._6_2_ = sVar100 + sStack_4fa + sStack_502 + uStack_100a;
        local_16b8._0_4_ =
             CONCAT22(sVar64 + sStack_586 + uStack_1016,sVar48 + local_588 + local_1018);
        local_16b8._0_6_ = CONCAT24(sVar70 + sStack_584 + uStack_1014,(undefined4)local_16b8);
        local_16b8 = CONCAT26(sVar76 + sStack_582 + uStack_1012,(undefined6)local_16b8);
        uStack_16b0._0_2_ = sVar82 + sStack_580 + uStack_1010;
        uStack_16b0._2_2_ = sVar88 + sStack_57e + uStack_100e;
        uStack_16b0._4_2_ = sVar94 + sStack_57c + uStack_100c;
        uStack_16b0._6_2_ = sVar100 + sStack_57a + uStack_100a;
        auVar34._8_8_ = uStack_1680;
        auVar34._0_8_ = local_1688;
        auVar51 = psraw(auVar34,ZEXT416(3));
        auVar33._8_8_ = uStack_1690;
        auVar33._0_8_ = local_1698;
        auVar52 = psraw(auVar33,ZEXT416(2));
        auVar32._8_8_ = uStack_16b0;
        auVar32._0_8_ = local_16b8;
        auVar53 = psraw(auVar32,ZEXT416(3));
        local_ed8 = auVar51._0_2_;
        sStack_ed6 = auVar51._2_2_;
        sStack_ed4 = auVar51._4_2_;
        sStack_ed2 = auVar51._6_2_;
        sStack_ed0 = auVar51._8_2_;
        sStack_ece = auVar51._10_2_;
        sStack_ecc = auVar51._12_2_;
        sStack_eca = auVar51._14_2_;
        local_ee8 = auVar52._0_2_;
        sStack_ee6 = auVar52._2_2_;
        sStack_ee4 = auVar52._4_2_;
        sStack_ee2 = auVar52._6_2_;
        sStack_ee0 = auVar52._8_2_;
        sStack_ede = auVar52._10_2_;
        sStack_edc = auVar52._12_2_;
        sStack_eda = auVar52._14_2_;
        bVar46 = (0 < local_ed8) * (local_ed8 < 0x100) * auVar51[0] - (0xff < local_ed8);
        bVar47 = (0 < sStack_ed6) * (sStack_ed6 < 0x100) * auVar51[2] - (0xff < sStack_ed6);
        bVar62 = (0 < sStack_ed4) * (sStack_ed4 < 0x100) * auVar51[4] - (0xff < sStack_ed4);
        bVar66 = (0 < sStack_ed2) * (sStack_ed2 < 0x100) * auVar51[6] - (0xff < sStack_ed2);
        bVar68 = (0 < sStack_ed0) * (sStack_ed0 < 0x100) * auVar51[8] - (0xff < sStack_ed0);
        bVar72 = (0 < sStack_ece) * (sStack_ece < 0x100) * auVar51[10] - (0xff < sStack_ece);
        bVar74 = (0 < sStack_ecc) * (sStack_ecc < 0x100) * auVar51[0xc] - (0xff < sStack_ecc);
        bVar61 = (0 < sStack_eca) * (sStack_eca < 0x100) * auVar51[0xe] - (0xff < sStack_eca);
        bVar63 = (0 < local_ee8) * (local_ee8 < 0x100) * auVar52[0] - (0xff < local_ee8);
        bVar67 = (0 < sStack_ee6) * (sStack_ee6 < 0x100) * auVar52[2] - (0xff < sStack_ee6);
        bVar69 = (0 < sStack_ee4) * (sStack_ee4 < 0x100) * auVar52[4] - (0xff < sStack_ee4);
        bVar73 = (0 < sStack_ee2) * (sStack_ee2 < 0x100) * auVar52[6] - (0xff < sStack_ee2);
        bVar75 = (0 < sStack_ee0) * (sStack_ee0 < 0x100) * auVar52[8] - (0xff < sStack_ee0);
        bVar79 = (0 < sStack_ede) * (sStack_ede < 0x100) * auVar52[10] - (0xff < sStack_ede);
        bVar81 = (0 < sStack_edc) * (sStack_edc < 0x100) * auVar52[0xc] - (0xff < sStack_edc);
        bVar85 = (0 < sStack_eda) * (sStack_eda < 0x100) * auVar52[0xe] - (0xff < sStack_eda);
        sStack_ef0 = auVar53._8_2_;
        sStack_eee = auVar53._10_2_;
        sStack_eec = auVar53._12_2_;
        sStack_eea = auVar53._14_2_;
        bVar93 = (0 < sStack_ef0) * (sStack_ef0 < 0x100) * auVar53[8] - (0xff < sStack_ef0);
        bVar97 = (0 < sStack_eee) * (sStack_eee < 0x100) * auVar53[10] - (0xff < sStack_eee);
        bVar99 = (0 < sStack_eec) * (sStack_eec < 0x100) * auVar53[0xc] - (0xff < sStack_eec);
        bVar103 = (0 < sStack_eea) * (sStack_eea < 0x100) * auVar53[0xe] - (0xff < sStack_eea);
        local_3b8 = auVar54[0];
        bStack_3b7 = auVar54[1];
        bStack_3b6 = auVar54[2];
        bStack_3b5 = auVar54[3];
        bStack_3b4 = auVar54[4];
        bStack_3b3 = auVar54[5];
        bStack_3b2 = auVar54[6];
        bStack_3b1 = auVar54[7];
        bStack_3b0 = auVar54[8];
        bStack_3af = auVar54[9];
        bStack_3ae = auVar54[10];
        bStack_3ad = auVar54[0xb];
        bStack_3ac = auVar54[0xc];
        bStack_3ab = auVar54[0xd];
        bStack_3aa = auVar54[0xe];
        bStack_3a9 = auVar54[0xf];
        bVar46 = (local_3b8 < bVar46) * local_3b8 | (local_3b8 >= bVar46) * bVar46;
        bVar60 = (bStack_3b7 < bVar47) * bStack_3b7 | (bStack_3b7 >= bVar47) * bVar47;
        bVar62 = (bStack_3b6 < bVar62) * bStack_3b6 | (bStack_3b6 >= bVar62) * bVar62;
        bVar66 = (bStack_3b5 < bVar66) * bStack_3b5 | (bStack_3b5 >= bVar66) * bVar66;
        bVar68 = (bStack_3b4 < bVar68) * bStack_3b4 | (bStack_3b4 >= bVar68) * bVar68;
        bVar72 = (bStack_3b3 < bVar72) * bStack_3b3 | (bStack_3b3 >= bVar72) * bVar72;
        bVar74 = (bStack_3b2 < bVar74) * bStack_3b2 | (bStack_3b2 >= bVar74) * bVar74;
        bVar78 = (bStack_3b1 < bVar61) * bStack_3b1 | (bStack_3b1 >= bVar61) * bVar61;
        bVar80 = (bStack_3b0 < bVar63) * bStack_3b0 | (bStack_3b0 >= bVar63) * bVar63;
        bVar84 = (bStack_3af < bVar67) * bStack_3af | (bStack_3af >= bVar67) * bVar67;
        bVar86 = (bStack_3ae < bVar69) * bStack_3ae | (bStack_3ae >= bVar69) * bVar69;
        bVar90 = (bStack_3ad < bVar73) * bStack_3ad | (bStack_3ad >= bVar73) * bVar73;
        bVar92 = (bStack_3ac < bVar75) * bStack_3ac | (bStack_3ac >= bVar75) * bVar75;
        bVar96 = (bStack_3ab < bVar79) * bStack_3ab | (bStack_3ab >= bVar79) * bVar79;
        bVar98 = (bStack_3aa < bVar81) * bStack_3aa | (bStack_3aa >= bVar81) * bVar81;
        bVar102 = (bStack_3a9 < bVar85) * bStack_3a9 | (bStack_3a9 >= bVar85) * bVar85;
        bStack_3c0 = (byte)uStack_400;
        bStack_3bf = (byte)((uint)uStack_400 >> 8);
        bStack_3be = (byte)((uint)uStack_400 >> 0x10);
        bStack_3bd = (byte)((uint)uStack_400 >> 0x18);
        local_3d8 = auVar58[0];
        bStack_3d7 = auVar58[1];
        bStack_3d6 = auVar58[2];
        bStack_3d5 = auVar58[3];
        bStack_3d4 = auVar58[4];
        bStack_3d3 = auVar58[5];
        bStack_3d2 = auVar58[6];
        bStack_3d1 = auVar58[7];
        bStack_3d0 = auVar58[8];
        bStack_3cf = auVar58[9];
        bStack_3ce = auVar58[10];
        bStack_3cd = auVar58[0xb];
        bStack_3cc = auVar58[0xc];
        bStack_3cb = auVar58[0xd];
        bStack_3ca = auVar58[0xe];
        bStack_3c9 = auVar58[0xf];
        bVar47 = (local_3d8 < local_c48) * local_3d8 | (local_3d8 >= local_c48) * local_c48;
        bVar61 = (bStack_3d7 < bStack_c47) * bStack_3d7 | (bStack_3d7 >= bStack_c47) * bStack_c47;
        bVar63 = (bStack_3d6 < bStack_c46) * bStack_3d6 | (bStack_3d6 >= bStack_c46) * bStack_c46;
        bVar67 = (bStack_3d5 < bStack_c45) * bStack_3d5 | (bStack_3d5 >= bStack_c45) * bStack_c45;
        bVar69 = (bStack_3d4 < local_c78) * bStack_3d4 | (bStack_3d4 >= local_c78) * local_c78;
        bVar73 = (bStack_3d3 < bStack_c77) * bStack_3d3 | (bStack_3d3 >= bStack_c77) * bStack_c77;
        bVar75 = (bStack_3d2 < bStack_c76) * bStack_3d2 | (bStack_3d2 >= bStack_c76) * bStack_c76;
        bVar79 = (bStack_3d1 < bStack_c75) * bStack_3d1 | (bStack_3d1 >= bStack_c75) * bStack_c75;
        bVar81 = (bStack_3d0 < bStack_3c0) * bStack_3d0 | (bStack_3d0 >= bStack_3c0) * bStack_3c0;
        bVar85 = (bStack_3cf < bStack_3bf) * bStack_3cf | (bStack_3cf >= bStack_3bf) * bStack_3bf;
        bVar87 = (bStack_3ce < bStack_3be) * bStack_3ce | (bStack_3ce >= bStack_3be) * bStack_3be;
        bVar91 = (bStack_3cd < bStack_3bd) * bStack_3cd | (bStack_3cd >= bStack_3bd) * bStack_3bd;
        bVar93 = (bStack_3cc < bVar93) * bStack_3cc | (bStack_3cc >= bVar93) * bVar93;
        bVar97 = (bStack_3cb < bVar97) * bStack_3cb | (bStack_3cb >= bVar97) * bVar97;
        bVar99 = (bStack_3ca < bVar99) * bStack_3ca | (bStack_3ca >= bVar99) * bVar99;
        bVar103 = (bStack_3c9 < bVar103) * bStack_3c9 | (bStack_3c9 >= bVar103) * bVar103;
        local_378 = auVar55[0];
        bStack_377 = auVar55[1];
        bStack_376 = auVar55[2];
        bStack_375 = auVar55[3];
        bStack_374 = auVar55[4];
        bStack_373 = auVar55[5];
        bStack_372 = auVar55[6];
        bStack_371 = auVar55[7];
        bStack_370 = auVar55[8];
        bStack_36f = auVar55[9];
        bStack_36e = auVar55[10];
        bStack_36d = auVar55[0xb];
        bStack_36c = auVar55[0xc];
        bStack_36b = auVar55[0xd];
        bStack_36a = auVar55[0xe];
        bStack_369 = auVar55[0xf];
        local_1688._0_2_ =
             CONCAT11((bVar60 < bStack_377) * bStack_377 | (bVar60 >= bStack_377) * bVar60,
                      (bVar46 < local_378) * local_378 | (bVar46 >= local_378) * bVar46);
        local_1688._0_3_ =
             CONCAT12((bVar62 < bStack_376) * bStack_376 | (bVar62 >= bStack_376) * bVar62,
                      (undefined2)local_1688);
        local_1688._0_4_ =
             CONCAT13((bVar66 < bStack_375) * bStack_375 | (bVar66 >= bStack_375) * bVar66,
                      (undefined3)local_1688);
        local_1688._0_5_ =
             CONCAT14((bVar68 < bStack_374) * bStack_374 | (bVar68 >= bStack_374) * bVar68,
                      (undefined4)local_1688);
        local_1688._0_6_ =
             CONCAT15((bVar72 < bStack_373) * bStack_373 | (bVar72 >= bStack_373) * bVar72,
                      (undefined5)local_1688);
        local_1688._0_7_ =
             CONCAT16((bVar74 < bStack_372) * bStack_372 | (bVar74 >= bStack_372) * bVar74,
                      (undefined6)local_1688);
        local_1688 = CONCAT17((bVar78 < bStack_371) * bStack_371 | (bVar78 >= bStack_371) * bVar78,
                              (undefined7)local_1688);
        uStack_1680._0_1_ = (bVar80 < bStack_370) * bStack_370 | (bVar80 >= bStack_370) * bVar80;
        uStack_1680._1_1_ = (bVar84 < bStack_36f) * bStack_36f | (bVar84 >= bStack_36f) * bVar84;
        uStack_1680._2_1_ = (bVar86 < bStack_36e) * bStack_36e | (bVar86 >= bStack_36e) * bVar86;
        uStack_1680._3_1_ = (bVar90 < bStack_36d) * bStack_36d | (bVar90 >= bStack_36d) * bVar90;
        uStack_1680._4_1_ = (bVar92 < bStack_36c) * bStack_36c | (bVar92 >= bStack_36c) * bVar92;
        uStack_1680._5_1_ = (bVar96 < bStack_36b) * bStack_36b | (bVar96 >= bStack_36b) * bVar96;
        uStack_1680._6_1_ = (bVar98 < bStack_36a) * bStack_36a | (bVar98 >= bStack_36a) * bVar98;
        uStack_1680._7_1_ = (bVar102 < bStack_369) * bStack_369 | (bVar102 >= bStack_369) * bVar102;
        local_398 = (byte)uStack_410;
        bStack_397 = (byte)((uint)uStack_410 >> 8);
        bStack_396 = (byte)((uint)uStack_410 >> 0x10);
        bStack_395 = (byte)((uint)uStack_410 >> 0x18);
        bStack_390 = auVar59[8];
        bStack_38f = auVar59[9];
        bStack_38e = auVar59[10];
        bStack_38d = auVar59[0xb];
        bStack_38c = auVar59[0xc];
        bStack_38b = auVar59[0xd];
        bStack_38a = auVar59[0xe];
        bStack_389 = auVar59[0xf];
        local_15c8._0_2_ =
             CONCAT11((bVar61 < bStack_397) * bStack_397 | (bVar61 >= bStack_397) * bVar61,
                      (bVar47 < local_398) * local_398 | (bVar47 >= local_398) * bVar47);
        local_15c8._0_4_ =
             CONCAT13((bVar67 < bStack_395) * bStack_395 | (bVar67 >= bStack_395) * bVar67,
                      CONCAT12((bVar63 < bStack_396) * bStack_396 | (bVar63 >= bStack_396) * bVar63,
                               (ushort)local_15c8));
        local_15c8 = CONCAT17((bVar79 < bStack_c71) * bStack_c71 | (bVar79 >= bStack_c71) * bVar79,
                              CONCAT16((bVar75 < bStack_c72) * bStack_c72 |
                                       (bVar75 >= bStack_c72) * bVar75,
                                       CONCAT15((bVar73 < bStack_c73) * bStack_c73 |
                                                (bVar73 >= bStack_c73) * bVar73,
                                                CONCAT14((bVar69 < bStack_c74) * bStack_c74 |
                                                         (bVar69 >= bStack_c74) * bVar69,
                                                         (undefined4)local_15c8))));
        uStack_15c0._0_4_ =
             CONCAT13((bVar91 < bStack_38d) * bStack_38d | (bVar91 >= bStack_38d) * bVar91,
                      CONCAT12((bVar87 < bStack_38e) * bStack_38e | (bVar87 >= bStack_38e) * bVar87,
                               CONCAT11((bVar85 < bStack_38f) * bStack_38f |
                                        (bVar85 >= bStack_38f) * bVar85,
                                        (bVar81 < bStack_390) * bStack_390 |
                                        (bVar81 >= bStack_390) * bVar81)));
        uStack_15c0 = CONCAT17((bVar103 < bStack_389) * bStack_389 |
                               (bVar103 >= bStack_389) * bVar103,
                               CONCAT16((bVar99 < bStack_38a) * bStack_38a |
                                        (bVar99 >= bStack_38a) * bVar99,
                                        CONCAT15((bVar97 < bStack_38b) * bStack_38b |
                                                 (bVar97 >= bStack_38b) * bVar97,
                                                 CONCAT14((bVar93 < bStack_38c) * bStack_38c |
                                                          (bVar93 >= bStack_38c) * bVar93,
                                                          (undefined4)uStack_15c0))));
        uStack_9e4 = (undefined4)((ulong)local_1688 >> 0x20);
        local_1588 = CONCAT44(local_9b8,(undefined4)local_1688);
        uStack_1580._0_4_ = uStack_9e4;
        uStack_1580._4_4_ = uStack_9b4;
        uStack_940 = local_1688._8_4_;
        uStack_93c = local_1688._12_4_;
        local_1598 = CONCAT44(uStack_3e0,uStack_940);
        uStack_1590._0_4_ = uStack_93c;
        uStack_1590._4_4_ = uStack_994;
        uVar43 = local_15c8._4_4_;
        local_15c8 = CONCAT44((undefined4)uStack_15c0,(undefined4)local_15c8);
        uStack_15c0 = CONCAT44(uStack_15c0._4_4_,uVar43);
        *(ulong *)((long)in_RDI - (long)(in_ESI * 3)) = local_15c8;
        *(undefined8 *)((long)in_RDI - (long)(in_ESI * 2)) = local_1598;
        *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_1588;
        *in_RDI = uStack_1580;
        *(undefined8 *)((long)in_RDI + (long)in_ESI) = uStack_1590;
        *(ulong *)((long)in_RDI + (long)(in_ESI * 2)) = uStack_15c0;
      }
      else {
        local_1718._0_2_ = CONCAT11(local_c28,local_c18);
        local_1718._0_4_ = CONCAT13(bStack_c27,CONCAT12(bStack_c17,(undefined2)local_1718));
        local_1718._0_6_ = CONCAT15(bStack_c26,CONCAT14(bStack_c16,(undefined4)local_1718));
        local_1718 = CONCAT17(bStack_c25,CONCAT16(bStack_c15,(undefined6)local_1718));
        local_1728._0_2_ = CONCAT11(local_c68,local_c58);
        local_1728._0_4_ = CONCAT13(bStack_c67,CONCAT12(bStack_c57,(undefined2)local_1728));
        local_1728._0_6_ = CONCAT15(bStack_c66,CONCAT14(bStack_c56,(undefined4)local_1728));
        local_1728 = CONCAT17(bStack_c65,CONCAT16(bStack_c55,(undefined6)local_1728));
        uStack_a86 = (undefined2)((uint)(undefined4)local_1718 >> 0x10);
        uStack_a84 = (undefined2)((uint6)(undefined6)local_1718 >> 0x20);
        uStack_a82 = (undefined2)(local_1718 >> 0x30);
        uStack_a96 = (undefined2)((uint)(undefined4)local_1728 >> 0x10);
        uStack_a94 = (undefined2)((uint6)(undefined6)local_1728 >> 0x20);
        uStack_a92 = (undefined2)(local_1728 >> 0x30);
        local_1728._0_4_ = CONCAT22((undefined2)local_1728,(undefined2)local_1718);
        local_1728._0_6_ = CONCAT24(uStack_a86,(undefined4)local_1728);
        local_1728 = CONCAT26(uStack_a96,(undefined6)local_1728);
        uStack_1720._0_2_ = uStack_a84;
        uStack_1720._2_2_ = uStack_a94;
        uStack_1720._4_2_ = uStack_a82;
        uStack_1720._6_2_ = uStack_a92;
        auVar13._8_8_ = uStack_1720;
        auVar13._0_8_ = local_1728;
        auVar12[8] = '\x03';
        auVar12[9] = -9;
        auVar12[10] = '\t';
        auVar12[0xb] = -3;
        auVar12[0xc] = '\x03';
        auVar12[0xd] = -9;
        auVar12[0xe] = '\t';
        auVar12[0xf] = -3;
        auVar12[0] = '\x03';
        auVar12[1] = -9;
        auVar12[2] = '\t';
        auVar12[3] = -3;
        auVar12[4] = '\x03';
        auVar12[5] = -9;
        auVar12[6] = '\t';
        auVar12[7] = -3;
        auVar51 = pmaddubsw(auVar13,auVar12);
        auVar37._8_8_ = CONCAT44(iVar45,iVar45);
        auVar37._0_8_ = CONCAT44(iVar45,iVar45);
        auVar36._8_8_ = CONCAT44(iVar45,iVar45);
        auVar36._0_8_ = CONCAT44(iVar45,iVar45);
        auVar52 = packssdw(auVar37,auVar36);
        auVar53 = psllw(auVar52,ZEXT416(1));
        auVar54 = psllw(auVar52,ZEXT416(3));
        local_5e8 = auVar53._0_2_;
        sStack_5e6 = auVar53._2_2_;
        sStack_5e4 = auVar53._4_2_;
        sStack_5e2 = auVar53._6_2_;
        sStack_5e0 = auVar53._8_2_;
        sStack_5de = auVar53._10_2_;
        sStack_5dc = auVar53._12_2_;
        sStack_5da = auVar53._14_2_;
        local_5f8 = auVar54._0_2_;
        sStack_5f6 = auVar54._2_2_;
        sStack_5f4 = auVar54._4_2_;
        sStack_5f2 = auVar54._6_2_;
        sStack_5f0 = auVar54._8_2_;
        sStack_5ee = auVar54._10_2_;
        sStack_5ec = auVar54._12_2_;
        sStack_5ea = auVar54._14_2_;
        auVar21._8_8_ = 0x1000100010001;
        auVar21._0_8_ = 0x1000100010001;
        auVar51 = pmaddwd(auVar51,auVar21);
        auVar11._8_8_ = uStack_1720;
        auVar11._0_8_ = local_1728;
        auVar59[8] = -2;
        auVar59[9] = '\x01';
        auVar59[10] = '\x01';
        auVar59[0xb] = -2;
        auVar59[0xc] = -2;
        auVar59[0xd] = '\x01';
        auVar59[0xe] = '\x01';
        auVar59[0xf] = -2;
        auVar59[0] = -2;
        auVar59[1] = '\x01';
        auVar59[2] = '\x01';
        auVar59[3] = -2;
        auVar59[4] = -2;
        auVar59[5] = '\x01';
        auVar59[6] = '\x01';
        auVar59[7] = -2;
        auVar53 = pmaddubsw(auVar11,auVar59);
        local_be8 = auVar51._0_4_;
        iStack_be4 = auVar51._4_4_;
        iStack_be0 = auVar51._8_4_;
        iStack_bdc = auVar51._12_4_;
        auVar51 = ZEXT416(4);
        local_1718 = CONCAT44(iStack_be4 + 1 >> auVar51,local_be8 + 8 >> auVar51);
        uStack_1710._0_4_ = iStack_be0 + 1 >> auVar51;
        uStack_1710._4_4_ = iStack_bdc + 1 >> auVar51;
        auVar41._8_8_ = uStack_1710;
        auVar41._0_8_ = local_1718;
        auVar40._8_8_ = 0xffffffffffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar51 = psignd(auVar41,auVar40);
        auVar39._8_8_ = 0xffffffffffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar54 = psignw(auVar52,auVar39);
        auVar35._8_8_ = uStack_1710;
        auVar35._0_8_ = local_1718;
        auVar51 = packssdw(auVar35,auVar51);
        auVar55 = pabsw(auVar51,auVar51);
        local_1d8 = auVar51._0_2_;
        sStack_1d6 = auVar51._2_2_;
        sStack_1d4 = auVar51._4_2_;
        sStack_1d2 = auVar51._6_2_;
        sStack_1d0 = auVar51._8_2_;
        sStack_1ce = auVar51._10_2_;
        sStack_1cc = auVar51._12_2_;
        sStack_1ca = auVar51._14_2_;
        local_1e8 = auVar52._0_2_;
        sStack_1e6 = auVar52._2_2_;
        sStack_1e4 = auVar52._4_2_;
        sStack_1e2 = auVar52._6_2_;
        sStack_1e0 = auVar52._8_2_;
        sStack_1de = auVar52._10_2_;
        sStack_1dc = auVar52._12_2_;
        sStack_1da = auVar52._14_2_;
        uVar49 = (ushort)(local_1e8 < local_1d8) * local_1e8 |
                 (ushort)(local_1e8 >= local_1d8) * local_1d8;
        uVar65 = (ushort)(sStack_1e6 < sStack_1d6) * sStack_1e6 |
                 (ushort)(sStack_1e6 >= sStack_1d6) * sStack_1d6;
        uVar71 = (ushort)(sStack_1e4 < sStack_1d4) * sStack_1e4 |
                 (ushort)(sStack_1e4 >= sStack_1d4) * sStack_1d4;
        uVar77 = (ushort)(sStack_1e2 < sStack_1d2) * sStack_1e2 |
                 (ushort)(sStack_1e2 >= sStack_1d2) * sStack_1d2;
        uVar83 = (ushort)(sStack_1e0 < sStack_1d0) * sStack_1e0 |
                 (ushort)(sStack_1e0 >= sStack_1d0) * sStack_1d0;
        uVar89 = (ushort)(sStack_1de < sStack_1ce) * sStack_1de |
                 (ushort)(sStack_1de >= sStack_1ce) * sStack_1ce;
        uVar95 = (ushort)(sStack_1dc < sStack_1cc) * sStack_1dc |
                 (ushort)(sStack_1dc >= sStack_1cc) * sStack_1cc;
        uVar101 = (ushort)(sStack_1da < sStack_1ca) * sStack_1da |
                  (ushort)(sStack_1da >= sStack_1ca) * sStack_1ca;
        auVar51 = psraw(auVar52,ZEXT416(1));
        local_188 = auVar54._0_2_;
        sStack_186 = auVar54._2_2_;
        sStack_184 = auVar54._4_2_;
        sStack_182 = auVar54._6_2_;
        sStack_180 = auVar54._8_2_;
        sStack_17e = auVar54._10_2_;
        sStack_17c = auVar54._12_2_;
        sStack_17a = auVar54._14_2_;
        uVar49 = (ushort)((short)uVar49 < local_188) * local_188 |
                 ((short)uVar49 >= local_188) * uVar49;
        uVar65 = (ushort)((short)uVar65 < sStack_186) * sStack_186 |
                 ((short)uVar65 >= sStack_186) * uVar65;
        uVar71 = (ushort)((short)uVar71 < sStack_184) * sStack_184 |
                 ((short)uVar71 >= sStack_184) * uVar71;
        uVar77 = (ushort)((short)uVar77 < sStack_182) * sStack_182 |
                 ((short)uVar77 >= sStack_182) * uVar77;
        uVar83 = (ushort)((short)uVar83 < sStack_180) * sStack_180 |
                 ((short)uVar83 >= sStack_180) * uVar83;
        uVar89 = (ushort)((short)uVar89 < sStack_17e) * sStack_17e |
                 ((short)uVar89 >= sStack_17e) * uVar89;
        uVar95 = (ushort)((short)uVar95 < sStack_17c) * sStack_17c |
                 ((short)uVar95 >= sStack_17c) * uVar95;
        uVar101 = (ushort)((short)uVar101 < sStack_17a) * sStack_17a |
                  ((short)uVar101 >= sStack_17a) * uVar101;
        local_1718._0_4_ = CONCAT22(uVar65,uVar49);
        local_1718._0_6_ = CONCAT24(uVar71,(undefined4)local_1718);
        local_1718 = CONCAT26(uVar77,(undefined6)local_1718);
        uStack_1710._0_2_ = uVar83;
        uStack_1710._2_2_ = uVar89;
        uStack_1710._4_2_ = uVar95;
        uStack_1710._6_2_ = uVar101;
        auVar38._8_8_ = 0xffffffffffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar52 = psignw(auVar51,auVar38);
        local_1c8 = auVar55._0_2_;
        sStack_1c6 = auVar55._2_2_;
        sStack_1c4 = auVar55._4_2_;
        sStack_1c2 = auVar55._6_2_;
        sStack_1c0 = auVar55._8_2_;
        sStack_1be = auVar55._10_2_;
        sStack_1bc = auVar55._12_2_;
        sStack_1ba = auVar55._14_2_;
        local_15d8._0_4_ =
             CONCAT22(-(ushort)(sStack_1c6 < (short)(sStack_5e6 + sStack_5f6)),
                      -(ushort)(local_1c8 < (short)(local_5e8 + local_5f8)));
        local_15d8._0_6_ =
             CONCAT24(-(ushort)(sStack_1c4 < (short)(sStack_5e4 + sStack_5f4)),
                      (undefined4)local_15d8);
        local_15d8 = CONCAT26(-(ushort)(sStack_1c2 < (short)(sStack_5e2 + sStack_5f2)),
                              (undefined6)local_15d8);
        uStack_15d0._0_2_ = -(ushort)(sStack_1c0 < (short)(sStack_5e0 + sStack_5f0));
        uStack_15d0._2_2_ = -(ushort)(sStack_1be < (short)(sStack_5de + sStack_5ee));
        uStack_15d0._4_2_ = -(ushort)(sStack_1bc < (short)(sStack_5dc + sStack_5ec));
        uStack_15d0._6_2_ = -(ushort)(sStack_1ba < (short)(sStack_5da + sStack_5ea));
        local_15a8._0_2_ = (ushort)local_c78;
        local_15c8._0_2_ = (ushort)local_c48;
        auVar58._8_4_ = 0x7060302;
        auVar58._12_4_ = 0xf0e0b0a;
        auVar58._0_4_ = 0x5040100;
        auVar58._4_4_ = 0xd0c0908;
        auVar53 = pshufb(auVar53,auVar58);
        local_628 = auVar53._0_2_;
        sStack_626 = auVar53._2_2_;
        sStack_624 = auVar53._4_2_;
        sStack_622 = auVar53._6_2_;
        sStack_620 = auVar53._8_2_;
        sStack_61e = auVar53._10_2_;
        sStack_61c = auVar53._12_2_;
        sStack_61a = auVar53._14_2_;
        uStack_646 = (ushort)bStack_c47;
        uStack_644 = (ushort)bStack_c46;
        uStack_642 = (ushort)bStack_c45;
        uStack_63e = (ushort)bStack_c77;
        uStack_63c = (ushort)bStack_c76;
        uStack_63a = (ushort)bStack_c75;
        local_1728._0_4_ =
             CONCAT22(sStack_626 + 1 + uStack_646 + uVar65 * 2,
                      local_628 + 1 + (ushort)local_15c8 + uVar49 * 2);
        local_1728._0_6_ = CONCAT24(sStack_624 + 1 + uStack_644 + uVar71 * 2,(undefined4)local_1728)
        ;
        local_1728 = CONCAT26(sStack_622 + 1 + uStack_642 + uVar77 * 2,(undefined6)local_1728);
        uStack_1720._0_2_ = sStack_620 + 1 + (ushort)local_15a8 + uVar83 * 2;
        uStack_1720._2_2_ = sStack_61e + 1 + uStack_63e + uVar89 * 2;
        uStack_1720._4_2_ = sStack_61c + 1 + uStack_63c + uVar95 * 2;
        uStack_1720._6_2_ = sStack_61a + 1 + uStack_63a + uVar101 * 2;
        auVar31._8_8_ = uStack_1720;
        auVar31._0_8_ = local_1728;
        auVar53 = psraw(auVar31,ZEXT416(2));
        local_15c8 = CONCAT44((uint)maskq0,(int)maskq1);
        local_15a8 = CONCAT44(local_1550,local_154c);
        local_15a8 = local_15a8 & local_15c8;
        local_15a8._4_4_ = (int)(local_15a8 >> 0x20);
        auVar54 = ZEXT416(0x1f);
        iVar44 = local_15a8._4_4_ >> auVar54;
        local_15a8 = CONCAT44((int)local_15a8 >> auVar54,((int)local_15a8 << 0x1f) >> auVar54);
        uStack_15a0 = CONCAT44(iVar44,iVar44);
        auVar54 = ZEXT416(0x1f);
        local_15c8 = CONCAT44((int)maskq1 >> auVar54,((int)maskq1 << 0x1f) >> auVar54);
        uStack_15c0 = CONCAT44((int)(uint)maskq0 >> auVar54,(int)(uint)maskq0 >> auVar54);
        local_15a8 = local_15d8 & local_15a8;
        local_1f8 = auVar53._0_2_;
        sStack_1f6 = auVar53._2_2_;
        sStack_1f4 = auVar53._4_2_;
        sStack_1f2 = auVar53._6_2_;
        sStack_1f0 = auVar53._8_2_;
        sStack_1ee = auVar53._10_2_;
        sStack_1ec = auVar53._12_2_;
        sStack_1ea = auVar53._14_2_;
        local_208 = auVar51._0_2_;
        sStack_206 = auVar51._2_2_;
        sStack_204 = auVar51._4_2_;
        sStack_202 = auVar51._6_2_;
        sStack_200 = auVar51._8_2_;
        sStack_1fe = auVar51._10_2_;
        sStack_1fc = auVar51._12_2_;
        sStack_1fa = auVar51._14_2_;
        uVar49 = (ushort)(local_208 < local_1f8) * local_208 |
                 (ushort)(local_208 >= local_1f8) * local_1f8;
        uVar65 = (ushort)(sStack_206 < sStack_1f6) * sStack_206 |
                 (ushort)(sStack_206 >= sStack_1f6) * sStack_1f6;
        uVar71 = (ushort)(sStack_204 < sStack_1f4) * sStack_204 |
                 (ushort)(sStack_204 >= sStack_1f4) * sStack_1f4;
        uVar77 = (ushort)(sStack_202 < sStack_1f2) * sStack_202 |
                 (ushort)(sStack_202 >= sStack_1f2) * sStack_1f2;
        uVar83 = (ushort)(sStack_200 < sStack_1f0) * sStack_200 |
                 (ushort)(sStack_200 >= sStack_1f0) * sStack_1f0;
        uVar89 = (ushort)(sStack_1fe < sStack_1ee) * sStack_1fe |
                 (ushort)(sStack_1fe >= sStack_1ee) * sStack_1ee;
        uVar95 = (ushort)(sStack_1fc < sStack_1ec) * sStack_1fc |
                 (ushort)(sStack_1fc >= sStack_1ec) * sStack_1ec;
        uVar101 = (ushort)(sStack_1fa < sStack_1ea) * sStack_1fa |
                  (ushort)(sStack_1fa >= sStack_1ea) * sStack_1ea;
        local_1a8 = auVar52._0_2_;
        sStack_1a6 = auVar52._2_2_;
        sStack_1a4 = auVar52._4_2_;
        sStack_1a2 = auVar52._6_2_;
        sStack_1a0 = auVar52._8_2_;
        sStack_19e = auVar52._10_2_;
        sStack_19c = auVar52._12_2_;
        sStack_19a = auVar52._14_2_;
        local_1728._0_4_ =
             CONCAT22((ushort)((short)uVar65 < sStack_1a6) * sStack_1a6 |
                      ((short)uVar65 >= sStack_1a6) * uVar65,
                      (ushort)((short)uVar49 < local_1a8) * local_1a8 |
                      ((short)uVar49 >= local_1a8) * uVar49);
        local_1728._0_6_ =
             CONCAT24((ushort)((short)uVar71 < sStack_1a4) * sStack_1a4 |
                      ((short)uVar71 >= sStack_1a4) * uVar71,(undefined4)local_1728);
        local_1728 = CONCAT26((ushort)((short)uVar77 < sStack_1a2) * sStack_1a2 |
                              ((short)uVar77 >= sStack_1a2) * uVar77,(undefined6)local_1728);
        uStack_1720._0_2_ =
             (ushort)((short)uVar83 < sStack_1a0) * sStack_1a0 |
             ((short)uVar83 >= sStack_1a0) * uVar83;
        uStack_1720._2_2_ =
             (ushort)((short)uVar89 < sStack_19e) * sStack_19e |
             ((short)uVar89 >= sStack_19e) * uVar89;
        uStack_1720._4_2_ =
             (ushort)((short)uVar95 < sStack_19c) * sStack_19c |
             ((short)uVar95 >= sStack_19c) * uVar95;
        uStack_1720._6_2_ =
             (ushort)((short)uVar101 < sStack_19a) * sStack_19a |
             ((short)uVar101 >= sStack_19a) * uVar101;
        local_1728 = local_1728 & local_15a8;
        uStack_1720 = uStack_1720 & uStack_15d0 & uStack_15a0;
        local_1718 = local_1718 & local_15d8 & local_15c8;
        uStack_1710 = uStack_1710 & uStack_15d0 & uStack_15c0;
        local_1588._0_2_ = (ushort)local_c28;
        local_1568._0_2_ = (ushort)local_c58;
        uStack_1560 = (ushort)bStack_c54;
        uStack_686 = (ushort)bStack_c27;
        uStack_684 = (ushort)bStack_c26;
        uStack_682 = (ushort)bStack_c25;
        uStack_680 = (ushort)bStack_c24;
        uStack_67e = (ushort)bStack_c23;
        uStack_67c = (ushort)bStack_c22;
        uStack_67a = (ushort)bStack_c21;
        local_698 = (short)local_1718;
        sStack_696 = (short)(local_1718 >> 0x10);
        sStack_694 = (short)(local_1718 >> 0x20);
        sStack_692 = (short)(local_1718 >> 0x30);
        local_698 = (ushort)local_1588 + local_698;
        sStack_696 = uStack_686 + sStack_696;
        sStack_694 = uStack_684 + sStack_694;
        sStack_692 = uStack_682 + sStack_692;
        uStack_6a6 = (ushort)bStack_c57;
        uStack_6a4 = (ushort)bStack_c56;
        uStack_6a2 = (ushort)bStack_c55;
        uStack_69e = (ushort)bStack_c53;
        uStack_69c = (ushort)bStack_c52;
        uStack_69a = (ushort)bStack_c51;
        local_6b8 = (short)local_15a8;
        sStack_6b6 = (short)(local_15a8 >> 0x10);
        sStack_6b4 = (short)(local_15a8 >> 0x20);
        sStack_6b2 = (short)(local_15a8 >> 0x30);
        sStack_6b0 = (short)uStack_420;
        sStack_6ae = (short)((uint)uStack_420 >> 0x10);
        sStack_6ac = (short)(uStack_1710 >> 0x20);
        sStack_6aa = (short)(uStack_1710 >> 0x30);
        sVar48 = (ushort)local_1568 + local_6b8;
        sVar64 = uStack_6a6 + sStack_6b6;
        sVar70 = uStack_6a4 + sStack_6b4;
        sVar76 = uStack_6a2 + sStack_6b2;
        sStack_6b0 = uStack_1560 + sStack_6b0;
        sStack_6ae = uStack_69e + sStack_6ae;
        sStack_6ac = uStack_69c + sStack_6ac;
        sStack_6aa = uStack_69a + sStack_6aa;
        local_1598._0_2_ = (ushort)local_c18;
        local_1578 = (ushort)local_c68;
        uStack_1570 = (ushort)bStack_c64;
        uStack_6c6 = (ushort)bStack_c17;
        uStack_6c4 = (ushort)bStack_c16;
        uStack_6c2 = (ushort)bStack_c15;
        uStack_6c0 = (ushort)bStack_c14;
        uStack_6be = (ushort)bStack_c13;
        uStack_6bc = (ushort)bStack_c12;
        uStack_6ba = (ushort)bStack_c11;
        local_6d8 = (short)local_1728;
        sStack_6d6 = (short)(local_1728 >> 0x10);
        sStack_6d4 = (short)(local_1728 >> 0x20);
        sStack_6d2 = (short)(local_1728 >> 0x30);
        local_6d8 = (ushort)local_1598 + local_6d8;
        sStack_6d6 = uStack_6c6 + sStack_6d6;
        sStack_6d4 = uStack_6c4 + sStack_6d4;
        sStack_6d2 = uStack_6c2 + sStack_6d2;
        uStack_6e6 = (ushort)bStack_c67;
        uStack_6e4 = (ushort)bStack_c66;
        uStack_6e2 = (ushort)bStack_c65;
        uStack_6de = (ushort)bStack_c63;
        uStack_6dc = (ushort)bStack_c62;
        uStack_6da = (ushort)bStack_c61;
        sStack_6f0 = (short)uStack_440;
        sStack_6ee = (short)((uint)uStack_440 >> 0x10);
        sStack_6ec = (short)(uStack_1720 >> 0x20);
        sStack_6ea = (short)(uStack_1720 >> 0x30);
        local_6b8 = local_1578 + local_6b8;
        sStack_6b6 = uStack_6e6 + sStack_6b6;
        sStack_6b4 = uStack_6e4 + sStack_6b4;
        sStack_6b2 = uStack_6e2 + sStack_6b2;
        sStack_6f0 = uStack_1570 + sStack_6f0;
        sStack_6ee = uStack_6de + sStack_6ee;
        sStack_6ec = uStack_6dc + sStack_6ec;
        sStack_6ea = uStack_6da + sStack_6ea;
        local_1598._0_2_ =
             CONCAT11((0 < sStack_6d6) * (sStack_6d6 < 0x100) * (char)sStack_6d6 -
                      (0xff < sStack_6d6),
                      (0 < local_6d8) * (local_6d8 < 0x100) * (char)local_6d8 - (0xff < local_6d8));
        local_1598._0_3_ =
             CONCAT12((0 < sStack_6d4) * (sStack_6d4 < 0x100) * (char)sStack_6d4 -
                      (0xff < sStack_6d4),(ushort)local_1598);
        local_1598._0_4_ =
             CONCAT13((0 < sStack_6d2) * (sStack_6d2 < 0x100) * (char)sStack_6d2 -
                      (0xff < sStack_6d2),(undefined3)local_1598);
        local_1598._0_5_ =
             CONCAT14((bStack_c14 != 0) * (uStack_6c0 < 0x100) * bStack_c14 - (0xff < uStack_6c0),
                      (undefined4)local_1598);
        local_1598._0_6_ =
             CONCAT15((bStack_c13 != 0) * (uStack_6be < 0x100) * bStack_c13 - (0xff < uStack_6be),
                      (undefined5)local_1598);
        local_1598._0_7_ =
             CONCAT16((bStack_c12 != 0) * (uStack_6bc < 0x100) * bStack_c12 - (0xff < uStack_6bc),
                      (undefined6)local_1598);
        local_1598 = CONCAT17((bStack_c11 != 0) * (uStack_6ba < 0x100) * bStack_c11 -
                              (0xff < uStack_6ba),(undefined7)local_1598);
        uStack_1590._0_1_ =
             (0 < local_6b8) * (local_6b8 < 0x100) * (char)local_6b8 - (0xff < local_6b8);
        uStack_1590._1_1_ =
             (0 < sStack_6b6) * (sStack_6b6 < 0x100) * (char)sStack_6b6 - (0xff < sStack_6b6);
        uStack_1590._2_1_ =
             (0 < sStack_6b4) * (sStack_6b4 < 0x100) * (char)sStack_6b4 - (0xff < sStack_6b4);
        uStack_1590._3_1_ =
             (0 < sStack_6b2) * (sStack_6b2 < 0x100) * (char)sStack_6b2 - (0xff < sStack_6b2);
        uStack_1590._4_1_ =
             (0 < sStack_6f0) * (sStack_6f0 < 0x100) * (char)sStack_6f0 - (0xff < sStack_6f0);
        uStack_1590._5_1_ =
             (0 < sStack_6ee) * (sStack_6ee < 0x100) * (char)sStack_6ee - (0xff < sStack_6ee);
        uStack_1590._6_1_ =
             (0 < sStack_6ec) * (sStack_6ec < 0x100) * (char)sStack_6ec - (0xff < sStack_6ec);
        uStack_1590._7_1_ =
             (0 < sStack_6ea) * (sStack_6ea < 0x100) * (char)sStack_6ea - (0xff < sStack_6ea);
        local_1588._0_2_ =
             CONCAT11((0 < sStack_696) * (sStack_696 < 0x100) * (char)sStack_696 -
                      (0xff < sStack_696),
                      (0 < local_698) * (local_698 < 0x100) * (char)local_698 - (0xff < local_698));
        local_1588._0_3_ =
             CONCAT12((0 < sStack_694) * (sStack_694 < 0x100) * (char)sStack_694 -
                      (0xff < sStack_694),(ushort)local_1588);
        local_1588._0_4_ =
             CONCAT13((0 < sStack_692) * (sStack_692 < 0x100) * (char)sStack_692 -
                      (0xff < sStack_692),(undefined3)local_1588);
        local_1588._0_5_ =
             CONCAT14((bStack_c24 != 0) * (uStack_680 < 0x100) * bStack_c24 - (0xff < uStack_680),
                      (undefined4)local_1588);
        local_1588._0_6_ =
             CONCAT15((bStack_c23 != 0) * (uStack_67e < 0x100) * bStack_c23 - (0xff < uStack_67e),
                      (undefined5)local_1588);
        local_1588._0_7_ =
             CONCAT16((bStack_c22 != 0) * (uStack_67c < 0x100) * bStack_c22 - (0xff < uStack_67c),
                      (undefined6)local_1588);
        local_1588 = CONCAT17((bStack_c21 != 0) * (uStack_67a < 0x100) * bStack_c21 -
                              (0xff < uStack_67a),(undefined7)local_1588);
        uStack_1580._0_1_ = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        uStack_1580._1_1_ = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        uStack_1580._2_1_ = (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70);
        uStack_1580._3_1_ = (0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76);
        uStack_1580._4_1_ =
             (0 < sStack_6b0) * (sStack_6b0 < 0x100) * (char)sStack_6b0 - (0xff < sStack_6b0);
        uStack_1580._5_1_ =
             (0 < sStack_6ae) * (sStack_6ae < 0x100) * (char)sStack_6ae - (0xff < sStack_6ae);
        uStack_1580._6_1_ =
             (0 < sStack_6ac) * (sStack_6ac < 0x100) * (char)sStack_6ac - (0xff < sStack_6ac);
        uStack_1580._7_1_ =
             (0 < sStack_6aa) * (sStack_6aa < 0x100) * (char)sStack_6aa - (0xff < sStack_6aa);
        *(undefined8 *)((long)in_RDI - (long)(in_ESI * 2)) = local_1598;
        *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_1588;
        *in_RDI = uStack_1580;
        *(undefined8 *)((long)in_RDI + (long)in_ESI) = uStack_1590;
      }
    }
  }
  return;
}

Assistant:

void ihevc_deblk_luma_horz_ssse3(UWORD8 *pu1_src,
                                 WORD32 src_strd,
                                 WORD32 bs,
                                 WORD32 quant_param_p,
                                 WORD32 quant_param_q,
                                 WORD32 beta_offset_div2,
                                 WORD32 tc_offset_div2,
                                 WORD32 filter_flag_p,
                                 WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;

    WORD32 d0, d3, dp, dq, d;
    WORD32 de_0, de_1, de_2, de_3;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;

    __m128i src_q0_8x16b, src_q1_8x16b, src_p0_8x16b, src_p1_8x16b, src_q2_8x16b;
    __m128i tmp_pq_str1_8x16b, src_p2_8x16b, tmp_pq_str0_8x16b;




    {
        __m128i src_tmp_p_0_8x16b, src_tmp_p_1_8x16b, src_tmp_q_0_8x16b, src_tmp_q_1_8x16b;
        __m128i coef_8x16b, mask_d_result_4x32b, mask_de_result_8x16b;
        __m128i mask_16x8b, temp_coef0_8x16b, temp_coef1_8x16b;

        ASSERT((bs > 0));
        ASSERT(filter_flag_p || filter_flag_q);

        qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
        beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

        /* BS based on implementation can take value 3 if it is intra/inter egde          */
        /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
        /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
        /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

        tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

        beta = gai4_ihevc_beta_table[beta_indx];
        tc = gai4_ihevc_tc_table[tc_indx];
        if(0 == tc)
        {
            return;
        }
        src_q0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src));
        src_q1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));
        src_p0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - src_strd));
        src_p1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 2 * src_strd));
        src_q2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd));
        tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd));
        src_p2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 3 * src_strd));
        tmp_pq_str0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 4 * src_strd));


        src_tmp_p_0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
        src_tmp_p_1_8x16b = _mm_unpacklo_epi8(tmp_pq_str0_8x16b, src_p2_8x16b);

        src_tmp_q_0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
        src_tmp_q_1_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);

        src_tmp_p_0_8x16b = _mm_unpacklo_epi16(src_tmp_p_1_8x16b, src_tmp_p_0_8x16b);
        src_tmp_q_0_8x16b = _mm_unpacklo_epi16(src_tmp_q_0_8x16b, src_tmp_q_1_8x16b);

        src_tmp_p_0_8x16b = _mm_shuffle_epi32(src_tmp_p_0_8x16b, 0x6c);
        src_tmp_q_0_8x16b = _mm_shuffle_epi32(src_tmp_q_0_8x16b, 0x6c);

        coef_8x16b = _mm_load_si128((__m128i *)(coef_d));
        mask_16x8b =  _mm_load_si128((__m128i *)(shuffle_d));

        src_tmp_p_0_8x16b = _mm_unpacklo_epi32(src_tmp_p_0_8x16b, src_tmp_q_0_8x16b);
        //WORD32 shuffle_d[4]={0x80800403,0x80800c0b,0x03000704,0x0b080f0c};
        mask_de_result_8x16b = _mm_shuffle_epi8(src_tmp_p_0_8x16b, mask_16x8b);

        mask_d_result_4x32b = _mm_maddubs_epi16(src_tmp_p_0_8x16b, coef_8x16b);


        //to get all 1's of 8 bit in (1)
        temp_coef0_8x16b = _mm_cmpeq_epi16(src_tmp_p_0_8x16b, src_tmp_p_0_8x16b);
        temp_coef1_8x16b = _mm_srli_epi16(temp_coef0_8x16b, 15);
        //accumulating values foe dp3 dq3 , dp0 dq0 values
        mask_d_result_4x32b = _mm_madd_epi16(mask_d_result_4x32b, temp_coef1_8x16b);

        temp_coef1_8x16b = _mm_packus_epi16(temp_coef1_8x16b, temp_coef1_8x16b);
        // to get all 1,-1 sets of 16 bits in (0)
        temp_coef0_8x16b = _mm_unpacklo_epi8(temp_coef0_8x16b, temp_coef1_8x16b);
        //q33-q30,p33-p30,q03-q00,p03-p00,0,q30-p30,0,q00-p00
        mask_de_result_8x16b = _mm_maddubs_epi16(mask_de_result_8x16b, temp_coef0_8x16b);
        //to get 16 bit 1's
        temp_coef0_8x16b = _mm_srli_epi16(temp_coef1_8x16b, 8);


        // dq3 dp3 dq0 dp0
        mask_d_result_4x32b = _mm_abs_epi32(mask_d_result_4x32b);
        mask_16x8b = _mm_shuffle_epi32(mask_d_result_4x32b, 0xec);
        mask_d_result_4x32b = _mm_shuffle_epi32(mask_d_result_4x32b, 0x49);
        // dq dp d3 d0
        mask_d_result_4x32b = _mm_add_epi32(mask_d_result_4x32b, mask_16x8b);
        //|q33-q30|,|p33-p30|,|q03-q00|,|p03-p00|,0,|q30-p30|,0,|q00-p00|
        mask_de_result_8x16b = _mm_abs_epi16(mask_de_result_8x16b);
        //|q33-q30|+|p33-p30|,|q03-q00|+|p03-p00|,0+|q30-p30|,0+|q00-p00|
        mask_de_result_8x16b = _mm_madd_epi16(mask_de_result_8x16b, temp_coef0_8x16b);

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_d_result_4x32b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_d_result_4x32b, 8);
        mask_16x8b = _mm_srli_si128(mask_d_result_4x32b, 12);

        d0 = _mm_cvtsi128_si32(mask_d_result_4x32b);
        d3 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        dp = _mm_cvtsi128_si32(temp_coef1_8x16b);
        dq = _mm_cvtsi128_si32(mask_16x8b);
        //getting d
        d = d0 + d3;

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_de_result_8x16b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_de_result_8x16b, 8);
        mask_16x8b = _mm_srli_si128(mask_de_result_8x16b, 12);

        de_0 = _mm_cvtsi128_si32(mask_de_result_8x16b);
        de_1 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        de_2 = _mm_cvtsi128_si32(temp_coef1_8x16b);
        de_3 = _mm_cvtsi128_si32(mask_16x8b);

        de = 0;
        dep = 0;
        deq = 0;
        if(d < beta)
        {
            d_sam0 = 0;
            if((2 * d0 < (beta >> 2))
                            && (de_2 < (beta >> 3))
                            && (de_0 < ((5 * tc + 1) >> 1)))
            {
                d_sam0 = 1;
            }

            d_sam3 = 0;
            if((2 * d3 < (beta >> 2))
                            && (de_3 < (beta >> 3))
                            && de_1 < ((5 * tc + 1) >> 1))
            {
                d_sam3 = 1;
            }

            de = (d_sam0 & d_sam3) + 1;
            dep = (dp < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            deq = (dq < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            if(tc <= 1)
            {
                dep = 0;
                deq = 0;
            }
        }

    }

    if(de != 0)
    {

        if(2 == de)
        {

            __m128i temp_pq0_str0_16x8b;
            __m128i temp_pq1_str0_16x8b, temp_pq1_str1_16x8b;
            __m128i temp_pq2_str0_16x8b;
            __m128i temp_str0_16x8b, temp_str1_16x8b;
            __m128i const2_8x16b, const2tc_8x16b;

            LWORD64 mask, tc2;
            tc = tc << 1;
            mask = (((LWORD64)filter_flag_q) << 63) | (((LWORD64)filter_flag_p) << 31);
            tc2 = ((LWORD64)tc);

            const2_8x16b = _mm_cmpeq_epi16(src_p1_8x16b, src_p1_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_pq0_str0_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            temp_str0_16x8b   = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 15);
            //arranged q31 q30 q21 q20 q1 q10 q01 q00 p30 p31 p20 p21 p10 p11 p00 p01
            temp_pq0_str0_16x8b = _mm_unpacklo_epi64(temp_pq0_str0_16x8b, temp_str0_16x8b);

            const2_8x16b = _mm_packus_epi16(const2_8x16b, const2_8x16b);
            temp_pq0_str0_16x8b = _mm_maddubs_epi16(temp_pq0_str0_16x8b, const2_8x16b);

            //q'1-2, p'1-2
            temp_pq1_str0_16x8b = _mm_unpacklo_epi8(src_p0_8x16b, src_q0_8x16b);
            temp_pq1_str1_16x8b = _mm_unpacklo_epi8(src_q1_8x16b, src_q2_8x16b);
            temp_str1_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p2_8x16b);
            // q30 p30 q20 p20 q10 p10 q01 q00 p30 q20 p20 q10 p10 q01 q00 p00
            temp_pq1_str0_16x8b = _mm_unpacklo_epi64(temp_pq1_str0_16x8b, temp_pq1_str0_16x8b);
            // q32 q31 q22 q21 q12 q11 q02 q01 p32 p31 p22 p21 p12 p11 p02 p01
            temp_pq1_str1_16x8b = _mm_unpacklo_epi64(temp_str1_16x8b, temp_pq1_str1_16x8b);

            temp_pq1_str0_16x8b = _mm_maddubs_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            temp_pq1_str1_16x8b = _mm_maddubs_epi16(temp_pq1_str1_16x8b, const2_8x16b);

            //clipping mask design
            temp_str1_16x8b = _mm_setzero_si128();
            temp_str0_16x8b = _mm_loadl_epi64((__m128i *)(&mask));
            const2tc_8x16b  = _mm_loadl_epi64((__m128i *)(&tc2));
            temp_str0_16x8b = _mm_shuffle_epi32(temp_str0_16x8b, 0x44);
            const2tc_8x16b  = _mm_shuffle_epi8(const2tc_8x16b, temp_str1_16x8b);

            //clipping mask design
            temp_str0_16x8b = _mm_srai_epi32(temp_str0_16x8b, 31);
            const2tc_8x16b = _mm_and_si128(const2tc_8x16b, temp_str0_16x8b);
            //calculating Clipping MAX for all pixel values.
            src_p0_8x16b = _mm_unpacklo_epi32(src_p0_8x16b, src_q0_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi32(src_p1_8x16b, src_q1_8x16b);
            //for clipping calc
            src_p1_8x16b = _mm_unpacklo_epi64(src_p0_8x16b, src_q0_8x16b);
            //saving the unmodified data of q1 p1 q0 p0
            src_q1_8x16b = _mm_unpackhi_epi64(src_p0_8x16b, src_q0_8x16b);
            //CLIpping MAX and MIN for q1 p1 q0 p0
            src_p0_8x16b = _mm_adds_epu8(src_p1_8x16b, const2tc_8x16b);
            src_p1_8x16b = _mm_subs_epu8(src_p1_8x16b, const2tc_8x16b);


            //q'2-q'0-2,p'2-p'0-2
            tmp_pq_str0_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq2_str0_16x8b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);
            const2_8x16b = _mm_slli_epi16(const2_8x16b, 1);
            //arranged q33 q32 q23 q22 q13 q12 q03 q02 p32 p33 p22 p23 p12 p13 p02 p03
            temp_pq2_str0_16x8b = _mm_unpacklo_epi64(tmp_pq_str0_8x16b, temp_pq2_str0_16x8b);
            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, src_q2_8x16b);
            temp_pq2_str0_16x8b = _mm_maddubs_epi16(temp_pq2_str0_16x8b, const2_8x16b);

            //calculating Clipping MAX and MIN for p2 and q2 .
            tmp_pq_str0_8x16b = _mm_adds_epu8(src_p2_8x16b, const2tc_8x16b);
            tmp_pq_str1_8x16b = _mm_subs_epu8(src_p2_8x16b, const2tc_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_str0_16x8b = _mm_shuffle_epi32(temp_pq0_str0_16x8b, 0x4e);
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, temp_str0_16x8b);
            //q'1-2 p'1-2
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq1_str1_16x8b);
            //to get 2 in 16 bit
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 8);


            //q'1, p'1 (adding 2)
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            //q'0-q'1,p'0-p'1
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, const2_8x16b);
            //q'2-q'1,p'2-p'1
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq2_str0_16x8b, const2_8x16b);
            //q'0 = (q'0-q'1)+q'1 ,p'0 = (p'0-p'1)+p'1;
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq0_str0_16x8b);
            //q'2 = (q'2-q'1)+q'1 ,p'2 = (p'2-p'1)+p'1;
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq2_str0_16x8b);

            //normalisation of all modified pixels
            temp_pq0_str0_16x8b = _mm_srai_epi16(temp_pq0_str0_16x8b, 3);
            temp_pq1_str0_16x8b = _mm_srai_epi16(temp_pq1_str0_16x8b, 2);
            temp_pq2_str0_16x8b = _mm_srai_epi16(temp_pq2_str0_16x8b, 3);
            //q'1 p'1 q'0 p'0
            temp_pq0_str0_16x8b = _mm_packus_epi16(temp_pq0_str0_16x8b, temp_pq1_str0_16x8b);
            temp_pq2_str0_16x8b = _mm_packus_epi16(temp_pq2_str0_16x8b, temp_pq2_str0_16x8b);
            //pack with the unmodified data of q2 and p2
            src_p2_8x16b = _mm_unpackhi_epi64(temp_pq2_str0_16x8b, src_p2_8x16b);
            //Clipping MAX and MIN for q'1 p'1 q'0 p'0 and q'2  p'2
            temp_pq0_str0_16x8b = _mm_min_epu8(temp_pq0_str0_16x8b, src_p0_8x16b);
            src_p2_8x16b = _mm_min_epu8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq0_str0_16x8b = _mm_max_epu8(temp_pq0_str0_16x8b, src_p1_8x16b);
            src_p2_8x16b = _mm_max_epu8(src_p2_8x16b, tmp_pq_str1_8x16b);
            //Reshuffling q'1 p'1 q'0 p'0 along with unmodified data
            src_p0_8x16b = _mm_unpacklo_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p1_8x16b = _mm_unpackhi_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0xd8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);
            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q2_8x16b = _mm_srli_si128(src_p2_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 3 * src_strd), src_p2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + 2 * src_strd), src_q2_8x16b);


        }

        else
        {

            __m128i tmp_delta0_8x16b, tmp_delta1_8x16b;
            __m128i tmp0_const_8x16b, tmp1_const_8x16b, tmp2_const_8x16b;
            __m128i coefdelta_0_8x16b;
            __m128i const2_8x16b, consttc_8x16b;

            LWORD64 maskp0, maskp1, maskq0, maskq1;
            maskp0 = (LWORD64)filter_flag_p;
            maskq0 = (LWORD64)filter_flag_q;
            maskp1 = (LWORD64)dep;
            maskq1 = (LWORD64)deq;
            consttc_8x16b = _mm_set1_epi32(tc);

            tmp_delta0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            tmp_delta1_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            //arranged q31 q30 p30 p31  q21 q20 p20 p21  q1 q10 p10 p11 q01 q00 p00 p01
            tmp_delta1_8x16b = _mm_unpacklo_epi16(tmp_delta0_8x16b, tmp_delta1_8x16b);

            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_de1);
            // (-3q1+9q0),(-9p0+3p1)
            tmp_delta0_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);

            //getting -tc store
            tmp2_const_8x16b = _mm_cmpeq_epi32(consttc_8x16b, consttc_8x16b);

            //getting tc in 16 bit
            consttc_8x16b = _mm_packs_epi32(consttc_8x16b, consttc_8x16b);
            //calc 10 *tc = 2*tc +8*tc ; 2*tc
            tmp_pq_str0_8x16b = _mm_slli_epi16(consttc_8x16b, 1);
            //calc 10 *tc = 2*tc +8*tc ; 8*tc
            tmp_pq_str1_8x16b = _mm_slli_epi16(consttc_8x16b, 3);

            //const 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //calc 10 *tc
            tmp_pq_str0_8x16b = _mm_add_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta0 without normalisation and clipping
            tmp_delta0_8x16b = _mm_madd_epi16(tmp_delta0_8x16b, const2_8x16b);

            const2_8x16b = _mm_srli_epi32(tmp2_const_8x16b, 31);

            //loaded coef for delta1 calculation
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_dep1);
            //(-2q1+q0),(p0-2p1)
            tmp_delta1_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //const 8
            const2_8x16b = _mm_slli_epi32(const2_8x16b, 3);

            //normalisation of the filter
            tmp_delta0_8x16b = _mm_add_epi32(tmp_delta0_8x16b, const2_8x16b);
            tmp_delta0_8x16b = _mm_srai_epi32(tmp_delta0_8x16b, 4);

            //getting deltaq0
            tmp_pq_str1_8x16b = _mm_sign_epi32(tmp_delta0_8x16b, tmp2_const_8x16b);
            //getting -tc
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //packing  d03q d02q d01q d0q d03p d02p d01p d00p
            tmp_delta0_8x16b = _mm_packs_epi32(tmp_delta0_8x16b, tmp_pq_str1_8x16b);
            //absolute delta
            tmp_pq_str1_8x16b = _mm_abs_epi16(tmp_delta0_8x16b);

            //Clipping of delta0
            tmp_delta0_8x16b = _mm_min_epi16(tmp_delta0_8x16b, consttc_8x16b);
            //tc>>1 16 bit
            consttc_8x16b = _mm_srai_epi16(consttc_8x16b, 1);
            //Clipping of delta0
            tmp_delta0_8x16b = _mm_max_epi16(tmp_delta0_8x16b, tmp1_const_8x16b);

            //(-tc)>>1 16 bit
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //mask for |delta| < 10*tc
            tmp_pq_str0_8x16b = _mm_cmpgt_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta 1 calc starts

            //getting q32 q22 q12 q02 p32 p12 p22 p02
            tmp0_const_8x16b = _mm_setzero_si128();
            src_q2_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi64(src_p2_8x16b, src_q2_8x16b);
            //constant 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //2*delta0
            tmp2_const_8x16b = _mm_add_epi16(tmp_delta0_8x16b, tmp_delta0_8x16b);
            //getting  all respective q's and p's together
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)(shuffle1));
            tmp_delta1_8x16b = _mm_shuffle_epi8(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //final adds for deltap1 and deltaq1
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, const2_8x16b);
            src_p2_8x16b = _mm_add_epi16(src_p2_8x16b, tmp2_const_8x16b);
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, src_p2_8x16b);
            tmp_delta1_8x16b = _mm_srai_epi16(tmp_delta1_8x16b, 2);

            //mask0= (((LWORD64)filter_flag_q)<<63)| (((LWORD64)filter_flag_p)<<31);
            tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq0)));
            src_p2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp0)));

            //   src_p2_8x16b = _mm_set_epi32(filter_flag_q,filter_flag_p,filter_flag_q,filter_flag_p);
            //mask1= (((LWORD64)(filter_flag_q&deq))<<63)|(((LWORD64)(filter_flag_p & dep))<<31);
            src_q2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq1)));
            coefdelta_0_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp1)));

            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, tmp_pq_str1_8x16b);
            src_q2_8x16b = _mm_unpacklo_epi32(coefdelta_0_8x16b, src_q2_8x16b);
            //src_q2_8x16b = _mm_set_epi32(deq,dep,deq,dep);
            src_q2_8x16b = _mm_and_si128(src_q2_8x16b, src_p2_8x16b);

            //rearranging the mask values
            src_q2_8x16b = _mm_shuffle_epi32(src_q2_8x16b, 0x50);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0x50);

            src_q2_8x16b = _mm_slli_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_slli_epi32(src_p2_8x16b, 31);
            src_q2_8x16b = _mm_srai_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_srai_epi32(src_p2_8x16b, 31);

            //combining mask delta1
            tmp_pq_str1_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_q2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_min_epi16(tmp_delta1_8x16b, consttc_8x16b);
            //combining mask delat0
            tmp_pq_str0_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_p2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_max_epi16(tmp_delta1_8x16b, tmp1_const_8x16b);


            //masking of the delta values |delta|<10*tc
            tmp_delta1_8x16b = _mm_and_si128(tmp_delta1_8x16b, tmp_pq_str1_8x16b);
            tmp_delta0_8x16b = _mm_and_si128(tmp_delta0_8x16b, tmp_pq_str0_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_unpacklo_epi8(src_p0_8x16b, tmp0_const_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_add_epi16(src_p0_8x16b, tmp_pq_str0_8x16b);
            src_q0_8x16b = _mm_add_epi16(src_q0_8x16b, tmp_pq_str1_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, tmp0_const_8x16b);
            src_q1_8x16b = _mm_unpacklo_epi8(src_q1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_add_epi16(src_p1_8x16b, tmp_pq_str0_8x16b);
            src_q1_8x16b = _mm_add_epi16(src_q1_8x16b, tmp_pq_str1_8x16b);
            //packing p1 q1 and p0 q0 to 8 bit
            src_p1_8x16b = _mm_packus_epi16(src_p1_8x16b, src_q1_8x16b);
            src_p0_8x16b = _mm_packus_epi16(src_p0_8x16b, src_q0_8x16b);

            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);


        }



    }

}